

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7_x509.cc
# Opt level: O2

PKCS7 * pkcs7_new(CBS *cbs)

{
  uint8_t *data;
  stack_st_X509 *out_certs;
  int iVar1;
  PKCS7 *a;
  ASN1_OBJECT *pAVar2;
  OPENSSL_STACK *pOVar3;
  size_t sVar4;
  uchar *puVar5;
  size_t sVar6;
  CBS copy;
  
  copy.data = cbs->data;
  copy.len = cbs->len;
  data = cbs->data;
  sVar6 = cbs->len;
  a = (PKCS7 *)OPENSSL_zalloc(0x20);
  if (a != (PKCS7 *)0x0) {
    pAVar2 = OBJ_nid2obj(0x16);
    *(ASN1_OBJECT **)&a->state = pAVar2;
    pAVar2 = (ASN1_OBJECT *)OPENSSL_malloc(0x10);
    a->type = pAVar2;
    if (pAVar2 != (ASN1_OBJECT *)0x0) {
      pOVar3 = OPENSSL_sk_new_null();
      a->type->sn = (char *)pOVar3;
      pOVar3 = OPENSSL_sk_new_null();
      a->type->ln = (char **)pOVar3;
      out_certs = (stack_st_X509 *)a->type->sn;
      if ((((out_certs != (stack_st_X509 *)0x0) && (a->type->ln != (char **)0x0)) &&
          (iVar1 = PKCS7_get_certificates(out_certs,&copy), iVar1 != 0)) &&
         (iVar1 = PKCS7_get_CRLs((stack_st_X509_CRL *)a->type->ln,cbs), iVar1 != 0)) {
        sVar4 = OPENSSL_sk_num((OPENSSL_STACK *)a->type->sn);
        if (sVar4 == 0) {
          OPENSSL_sk_free((OPENSSL_STACK *)a->type->sn);
          a->type->sn = (char *)0x0;
        }
        sVar4 = OPENSSL_sk_num((OPENSSL_STACK *)a->type->ln);
        if (sVar4 == 0) {
          OPENSSL_sk_free((OPENSSL_STACK *)a->type->ln);
          a->type->ln = (char **)0x0;
        }
        sVar6 = sVar6 - cbs->len;
        a->length = sVar6;
        puVar5 = (uchar *)OPENSSL_memdup(data,sVar6);
        a->asn1 = puVar5;
        if (puVar5 != (uchar *)0x0) {
          return (PKCS7 *)a;
        }
      }
    }
    PKCS7_free(a);
  }
  return (PKCS7 *)0x0;
}

Assistant:

static PKCS7 *pkcs7_new(CBS *cbs) {
  CBS copy = *cbs, copy2 = *cbs;
  PKCS7 *ret = reinterpret_cast<PKCS7 *>(OPENSSL_zalloc(sizeof(PKCS7)));
  if (ret == NULL) {
    return NULL;
  }
  ret->type = OBJ_nid2obj(NID_pkcs7_signed);
  ret->d.sign =
      reinterpret_cast<PKCS7_SIGNED *>(OPENSSL_malloc(sizeof(PKCS7_SIGNED)));
  if (ret->d.sign == NULL) {
    goto err;
  }
  ret->d.sign->cert = sk_X509_new_null();
  ret->d.sign->crl = sk_X509_CRL_new_null();
  if (ret->d.sign->cert == NULL || ret->d.sign->crl == NULL ||
      !PKCS7_get_certificates(ret->d.sign->cert, &copy) ||
      !PKCS7_get_CRLs(ret->d.sign->crl, cbs)) {
    goto err;
  }

  if (sk_X509_num(ret->d.sign->cert) == 0) {
    sk_X509_free(ret->d.sign->cert);
    ret->d.sign->cert = NULL;
  }

  if (sk_X509_CRL_num(ret->d.sign->crl) == 0) {
    sk_X509_CRL_free(ret->d.sign->crl);
    ret->d.sign->crl = NULL;
  }

  ret->ber_len = CBS_len(&copy2) - CBS_len(cbs);
  ret->ber_bytes = reinterpret_cast<uint8_t *>(
      OPENSSL_memdup(CBS_data(&copy2), ret->ber_len));
  if (ret->ber_bytes == NULL) {
    goto err;
  }

  return ret;

err:
  PKCS7_free(ret);
  return NULL;
}